

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O0

int inxsearch(nn_quant *nnq,int al,int b,int g,int r)

{
  nq_pixel *paiVar1;
  int local_44;
  int best;
  int *p;
  int local_30;
  int bestd;
  int a;
  int dist;
  int j;
  int i;
  int r_local;
  int g_local;
  int b_local;
  int al_local;
  nn_quant *nnq_local;
  
  p._4_4_ = 1000;
  local_44 = -1;
  dist = nnq->netindex[g];
  a = dist + -1;
  while (dist < nnq->netsize || -1 < a) {
    if (dist < nnq->netsize) {
      paiVar1 = nnq->network + dist;
      bestd = (*paiVar1)[2] - g;
      if (bestd < p._4_4_) {
        dist = dist + 1;
        if (bestd < 0) {
          bestd = -bestd;
        }
        local_30 = (*paiVar1)[1] - b;
        if (local_30 < 0) {
          local_30 = -local_30;
        }
        bestd = local_30 + bestd;
        if (bestd < p._4_4_) {
          local_30 = (*paiVar1)[3] - r;
          if (local_30 < 0) {
            local_30 = -local_30;
          }
          bestd = local_30 + bestd;
        }
        if (bestd < p._4_4_) {
          local_30 = (*paiVar1)[0] - al;
          if (local_30 < 0) {
            local_30 = -local_30;
          }
          bestd = local_30 + bestd;
        }
        if (bestd < p._4_4_) {
          p._4_4_ = bestd;
          local_44 = (*paiVar1)[4];
        }
      }
      else {
        dist = nnq->netsize;
      }
    }
    if (-1 < a) {
      paiVar1 = nnq->network + a;
      bestd = g - (*paiVar1)[2];
      if (bestd < p._4_4_) {
        a = a + -1;
        if (bestd < 0) {
          bestd = -bestd;
        }
        local_30 = (*paiVar1)[1] - b;
        if (local_30 < 0) {
          local_30 = -local_30;
        }
        bestd = local_30 + bestd;
        if (bestd < p._4_4_) {
          local_30 = (*paiVar1)[3] - r;
          if (local_30 < 0) {
            local_30 = -local_30;
          }
          bestd = local_30 + bestd;
        }
        if (bestd < p._4_4_) {
          local_30 = (*paiVar1)[0] - al;
          if (local_30 < 0) {
            local_30 = -local_30;
          }
          bestd = local_30 + bestd;
        }
        if (bestd < p._4_4_) {
          p._4_4_ = bestd;
          local_44 = (*paiVar1)[4];
        }
      }
      else {
        a = -1;
      }
    }
  }
  return local_44;
}

Assistant:

int inxsearch(nnq, al,b,g,r)
nn_quant *nnq;
register int al, b, g, r;
{
	register int i, j, dist, a, bestd;
	register int *p;
	int best;

	bestd = 1000;		/* biggest possible dist is 256*3 */
	best = -1;
	i = nnq->netindex[g];	/* index on g */
	j = i-1;		/* start at netindex[g] and work outwards */

	while ((i<nnq->netsize) || (j>=0)) {
		if (i< nnq->netsize) {
			p = nnq->network[i];
			dist = p[2] - g;		/* inx key */
			if (dist >= bestd) i = nnq->netsize;	/* stop iter */
			else {
				i++;
				if (dist<0) dist = -dist;
				a = p[1] - b;
				if (a<0) a = -a;
				dist += a;
				if (dist<bestd) {
					a = p[3] - r;
					if (a<0) a = -a;
					dist += a;
				}
				if(dist<bestd) {
					a = p[0] - al;
					if (a<0) a = -a;
					dist += a;
				}
				if (dist<bestd) {
					bestd=dist;
					best=p[4];
				}
			}
		}

		if (j>=0) {
			p = nnq->network[j];
			dist = g - p[2]; /* inx key - reverse dif */
			if (dist >= bestd) j = -1; /* stop iter */
			else {
				j--;
				if (dist<0) dist = -dist;
				a = p[1] - b;
				if (a<0) a = -a;
				dist += a;
				if (dist<bestd) {
					a = p[3] - r;
					if (a<0) a = -a;
					dist += a;
				}
				if(dist<bestd) {
					a = p[0] - al;
					if (a<0) a = -a;
					dist += a;
				}
				if (dist<bestd) {
					bestd=dist;
					best=p[4];
				}
			}
		}
	}

	return(best);
}